

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

void supdup_send_36bits(Supdup *supdup,unsigned_long_long thirtysix)

{
  byte local_1d;
  int local_1c;
  char sixBits;
  unsigned_long_long uStack_18;
  int i;
  unsigned_long_long thirtysix_local;
  Supdup *supdup_local;
  
  uStack_18 = thirtysix;
  thirtysix_local = (unsigned_long_long)supdup;
  for (local_1c = 5; -1 < local_1c; local_1c = local_1c + -1) {
    local_1d = (byte)(uStack_18 >> ((char)local_1c * '\x06' & 0x3fU)) & 0x3f;
    sk_write(*(Socket **)thirtysix_local,&local_1d,1);
  }
  return;
}

Assistant:

static void supdup_send_36bits(Supdup *supdup, unsigned long long thirtysix)
{
    //
    // From RFC734:
    // "Each word is sent through the 8-bit connection as six
    //  6-bit bytes, most-significant first."
    //
    // Split the 36-bit word into 6 6-bit "bytes", packed into
    // 8-bit bytes and send, most-significant byte first.
    //
    for (int i = 5; i >= 0; i--) {
        char sixBits = (thirtysix >> (i * 6)) & 077;
        sk_write(supdup->s, &sixBits, 1);
    }
}